

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall
pbrt::Image::Image(Image *this,PixelFormat format,Point2i resolution,
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  channels,ColorEncodingHandle *encoding,Allocator alloc)

{
  int iVar1;
  int local_50;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  this->format = format;
  (this->resolution).super_Tuple2<pbrt::Point2,_int> = resolution.super_Tuple2<pbrt::Point2,_int>;
  local_38.memoryResource = pstd::pmr::new_delete_resource();
  InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
  InlinedVector<std::__cxx11::string_const*>
            ((InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>
              *)&this->channelNames,channels.ptr,channels.ptr + channels.n,&local_38);
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->encoding).
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
  (this->p8).alloc.memoryResource = alloc.memoryResource;
  (this->p8).ptr = (uchar *)0x0;
  (this->p8).nAlloc = 0;
  (this->p8).nStored = 0;
  (this->p16).alloc.memoryResource = alloc.memoryResource;
  (this->p16).ptr = (Half *)0x0;
  (this->p16).nAlloc = 0;
  (this->p16).nStored = 0;
  (this->p32).alloc.memoryResource = alloc.memoryResource;
  (this->p32).nStored = 0;
  (this->p32).ptr = (float *)0x0;
  (this->p32).nAlloc = 0;
  iVar1 = resolution.super_Tuple2<pbrt::Point2,_int>.y;
  local_50 = resolution.super_Tuple2<pbrt::Point2,_int>.x;
  if (format == Float) {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
              (&this->p32,(long)(iVar1 * local_50 * (int)(this->channelNames).nStored));
  }
  else if (format == Half) {
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::resize
              (&this->p16,(long)(iVar1 * local_50 * (int)(this->channelNames).nStored));
  }
  else {
    if (format != U256) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0xe8,"Unhandled format in Image::Image()");
    }
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::resize
              (&this->p8,(long)(iVar1 * local_50 * (int)(this->channelNames).nStored));
    if ((encoding->
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        ).bits == 0) {
      LogFatal<char_const(&)[20]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
                 ,0xe2,"Check failed: %s",(char (*) [20])"encoding != nullptr");
    }
  }
  return;
}

Assistant:

Image::Image(PixelFormat format, Point2i resolution,
             pstd::span<const std::string> channels, ColorEncodingHandle encoding,
             Allocator alloc)
    : format(format),
      resolution(resolution),
      channelNames(channels.begin(), channels.end()),
      encoding(encoding),
      p8(alloc),
      p16(alloc),
      p32(alloc) {
    if (Is8Bit(format)) {
        p8.resize(NChannels() * resolution[0] * resolution[1]);
        CHECK(encoding != nullptr);
    } else if (Is16Bit(format))
        p16.resize(NChannels() * resolution[0] * resolution[1]);
    else if (Is32Bit(format))
        p32.resize(NChannels() * resolution[0] * resolution[1]);
    else
        LOG_FATAL("Unhandled format in Image::Image()");
}